

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visit
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Expression *curr)

{
  char cVar1;
  undefined8 in_RAX;
  Type TVar2;
  ostream *poVar3;
  uint uVar4;
  undefined8 uStack_38;
  
  uVar4 = this->depth + 1;
  this->depth = uVar4;
  uStack_38 = in_RAX;
  if (this->maxDepth < uVar4 && this->maxDepth != 0) {
    (*this->_vptr_ExpressionRunner[3])(this,"interpreter recursion limit");
  }
  Visitor<wasm::ModuleRunner,_wasm::Flow>::visit
            (__return_storage_ptr__,(Visitor<wasm::ModuleRunner,_wasm::Flow> *)this,curr);
  if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
    TVar2 = Literals::getType(&__return_storage_ptr__->values);
    if ((1 < TVar2.id) || (1 < (curr->type).id)) {
      cVar1 = ::wasm::Type::isSubType(TVar2,(Type)(curr->type).id);
      if (cVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"expected ",9);
        poVar3 = (ostream *)std::operator<<(&std::cerr,this->module,(curr->type).id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", seeing ",9);
        poVar3 = (ostream *)std::operator<<(poVar3,this->module,TVar2.id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," from\n",6);
        poVar3 = (ostream *)std::operator<<(poVar3,this->module,curr);
        uStack_38 = CONCAT17(10,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_38 + 7),1);
      }
      cVar1 = ::wasm::Type::isSubType(TVar2,(Type)(curr->type).id);
      if (cVar1 == '\0') {
        __assert_fail("Type::isSubType(type, curr->type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x10b,
                      "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visit(Expression *) [SubType = wasm::ModuleRunner]"
                     );
      }
    }
  }
  this->depth = this->depth - 1;
  return __return_storage_ptr__;
}

Assistant:

Flow visit(Expression* curr) {
    depth++;
    if (maxDepth != NO_LIMIT && depth > maxDepth) {
      hostLimit("interpreter recursion limit");
    }
    auto ret = OverriddenVisitor<SubType, Flow>::visit(curr);
    if (!ret.breaking()) {
      Type type = ret.getType();
      if (type.isConcrete() || curr->type.isConcrete()) {
#if 1 // def WASM_INTERPRETER_DEBUG
        if (!Type::isSubType(type, curr->type)) {
          std::cerr << "expected " << ModuleType(*module, curr->type)
                    << ", seeing " << ModuleType(*module, type) << " from\n"
                    << ModuleExpression(*module, curr) << '\n';
        }
#endif
        assert(Type::isSubType(type, curr->type));
      }
    }
    depth--;
    return ret;
  }